

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugLocationPropagation.cpp
# Opt level: O0

void wasm::DebugLocationPropagation::doPreVisit(DebugLocationPropagation *self,Expression **currp)

{
  bool bVar1;
  Function *pFVar2;
  pointer ppVar3;
  mapped_type *pmVar4;
  DebugLocation *__u;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
  local_58;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
  local_50;
  iterator it;
  Expression *previous;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
  local_38;
  SmallVector<wasm::Expression_*,_10UL> *local_30;
  ExpressionStack *expressionStack;
  unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
  *locs;
  Expression *curr;
  Expression **currp_local;
  DebugLocationPropagation *self_local;
  
  locs = (unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
          *)*currp;
  curr = (Expression *)currp;
  currp_local = (Expression **)self;
  pFVar2 = Walker<wasm::DebugLocationPropagation,_wasm::Visitor<wasm::DebugLocationPropagation,_void>_>
           ::getFunction(&(self->
                          super_WalkerPass<wasm::PostWalker<wasm::DebugLocationPropagation,_wasm::Visitor<wasm::DebugLocationPropagation,_void>_>_>
                          ).
                          super_PostWalker<wasm::DebugLocationPropagation,_wasm::Visitor<wasm::DebugLocationPropagation,_void>_>
                          .
                          super_Walker<wasm::DebugLocationPropagation,_wasm::Visitor<wasm::DebugLocationPropagation,_void>_>
                        );
  expressionStack = (ExpressionStack *)&pFVar2->debugLocations;
  local_30 = (SmallVector<wasm::Expression_*,_10UL> *)(currp_local + 0x26);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
       ::find((unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
               *)expressionStack,(key_type *)&locs);
  previous = (Expression *)
             std::
             unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
             ::end((unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
                    *)expressionStack);
  bVar1 = std::__detail::operator==
                    (&local_38,
                     (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                      *)&previous);
  if (bVar1) {
    it.
    super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
               )getPrevious((DebugLocationPropagation *)currp_local);
    if (it.
        super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      pFVar2 = Walker<wasm::DebugLocationPropagation,_wasm::Visitor<wasm::DebugLocationPropagation,_void>_>
               ::getFunction((Walker<wasm::DebugLocationPropagation,_wasm::Visitor<wasm::DebugLocationPropagation,_void>_>
                              *)(currp_local + 0xb));
      bVar1 = std::optional::operator_cast_to_bool((optional *)&pFVar2->prologLocation);
      if (bVar1) {
        pFVar2 = Walker<wasm::DebugLocationPropagation,_wasm::Visitor<wasm::DebugLocationPropagation,_void>_>
                 ::getFunction((Walker<wasm::DebugLocationPropagation,_wasm::Visitor<wasm::DebugLocationPropagation,_void>_>
                                *)(currp_local + 0xb));
        __u = std::optional<wasm::Function::DebugLocation>::operator*(&pFVar2->prologLocation);
        pmVar4 = std::
                 unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
                 ::operator[]((unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
                               *)expressionStack,(key_type *)&locs);
        std::optional<wasm::Function::DebugLocation>::operator=(pmVar4,__u);
      }
    }
    else {
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
           ::find((unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
                   *)expressionStack,(key_type *)&it);
      local_58._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
           ::end((unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
                  *)expressionStack);
      bVar1 = std::__detail::operator!=(&local_50,&local_58);
      if (bVar1) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false,_false>
                               *)&local_50);
        pmVar4 = std::
                 unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
                 ::operator[]((unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
                               *)expressionStack,(key_type *)&locs);
        *(undefined8 *)
         &(pmVar4->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
          super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload =
             *(undefined8 *)
              &(ppVar3->second).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
               _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload;
        *(undefined8 *)
         ((long)&(pmVar4->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                 _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload +
         8) = *(undefined8 *)
               ((long)&(ppVar3->second).
                       super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload + 8);
        *(undefined8 *)
         ((long)&(pmVar4->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                 _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload.
                 _M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload
         + 4) = *(undefined8 *)
                 ((long)&(ppVar3->second).
                         super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload.
                         _M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true> + 4
                 );
      }
    }
  }
  SmallVector<wasm::Expression_*,_10UL>::push_back(local_30,(Expression **)&locs);
  return;
}

Assistant:

static void doPreVisit(DebugLocationPropagation* self, Expression** currp) {
    auto* curr = *currp;
    auto& locs = self->getFunction()->debugLocations;
    auto& expressionStack = self->expressionStack;
    if (locs.find(curr) == locs.end()) {
      // No debug location, see if we should inherit one.
      if (auto* previous = self->getPrevious()) {
        if (auto it = locs.find(previous); it != locs.end()) {
          locs[curr] = it->second;
        }
      } else if (self->getFunction()->prologLocation) {
        // Instructions may inherit their locations from the function
        // prolog.
        locs[curr] = *self->getFunction()->prologLocation;
      }
    }
    expressionStack.push_back(curr);
  }